

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O0

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::ParquetMetaDataInit<(duckdb::ParquetMetadataOperatorType)1>
           (ClientContext *context,TableFunctionInitInput *input)

{
  ParquetMetaDataBindData *pPVar1;
  MultiFileList *this;
  pointer result_file;
  MultiFileList *in_RSI;
  MultiFileList *in_RDI;
  templated_unique_single_t result;
  ParquetMetaDataBindData *bind_data;
  OpenFileInfo *in_stack_00000378;
  vector<duckdb::LogicalType,_true> *in_stack_00000380;
  ClientContext *in_stack_00000388;
  ParquetMetaDataOperatorData *in_stack_00000390;
  shared_ptr<duckdb::MultiFileList,_true> *in_stack_ffffffffffffff40;
  OpenFileInfo *this_00;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff60;
  ClientContext *in_stack_ffffffffffffff68;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> this_01;
  
  this_01._M_head_impl = (GlobalTableFunctionState *)in_RDI;
  optional_ptr<const_duckdb::FunctionData,_true>::operator->
            ((optional_ptr<const_duckdb::FunctionData,_true> *)in_stack_ffffffffffffff40);
  pPVar1 = FunctionData::Cast<duckdb::ParquetMetaDataBindData>
                     ((FunctionData *)in_stack_ffffffffffffff40);
  make_uniq<duckdb::ParquetMetaDataOperatorData,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>const&>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  this = shared_ptr<duckdb::MultiFileList,_true>::operator->(in_stack_ffffffffffffff40);
  result_file = unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
                ::operator->((unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
                              *)in_stack_ffffffffffffff40);
  MultiFileList::InitializeScan(this,&result_file->file_list_scan);
  shared_ptr<duckdb::MultiFileList,_true>::operator->(in_stack_ffffffffffffff40);
  unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
  ::operator->((unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
                *)in_stack_ffffffffffffff40);
  unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
  ::operator->((unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
                *)in_stack_ffffffffffffff40);
  MultiFileList::Scan((MultiFileList *)this_01._M_head_impl,(MultiFileListScanData *)in_RDI,
                      (OpenFileInfo *)result_file);
  unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
  ::operator->((unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
                *)in_stack_ffffffffffffff40);
  this_00 = (OpenFileInfo *)&pPVar1->return_types;
  shared_ptr<duckdb::MultiFileList,_true>::operator->
            ((shared_ptr<duckdb::MultiFileList,_true> *)this_00);
  MultiFileList::GetFirstFile(in_RSI);
  ParquetMetaDataOperatorData::LoadSchemaData
            (in_stack_00000390,in_stack_00000388,in_stack_00000380,in_stack_00000378);
  OpenFileInfo::~OpenFileInfo(this_00);
  unique_ptr<duckdb::GlobalTableFunctionState,std::default_delete<duckdb::GlobalTableFunctionState>,true>
  ::
  unique_ptr<duckdb::ParquetMetaDataOperatorData,std::default_delete<std::unique_ptr<duckdb::GlobalTableFunctionState,std::default_delete<duckdb::GlobalTableFunctionState>>>,void>
            ((unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
              *)this_00,
             (unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>_>
              *)in_RSI);
  unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
                 *)0x21d57e3);
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(_Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )this_01._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> ParquetMetaDataInit(ClientContext &context, TableFunctionInitInput &input) {
	auto &bind_data = input.bind_data->Cast<ParquetMetaDataBindData>();

	auto result = make_uniq<ParquetMetaDataOperatorData>(context, bind_data.return_types);

	bind_data.file_list->InitializeScan(result->file_list_scan);
	bind_data.file_list->Scan(result->file_list_scan, result->current_file);

	D_ASSERT(!bind_data.file_list->IsEmpty());

	switch (TYPE) {
	case ParquetMetadataOperatorType::SCHEMA:
		result->LoadSchemaData(context, bind_data.return_types, bind_data.file_list->GetFirstFile());
		break;
	case ParquetMetadataOperatorType::META_DATA:
		result->LoadRowGroupMetadata(context, bind_data.return_types, bind_data.file_list->GetFirstFile());
		break;
	case ParquetMetadataOperatorType::KEY_VALUE_META_DATA:
		result->LoadKeyValueMetaData(context, bind_data.return_types, bind_data.file_list->GetFirstFile());
		break;
	case ParquetMetadataOperatorType::FILE_META_DATA:
		result->LoadFileMetaData(context, bind_data.return_types, bind_data.file_list->GetFirstFile());
		break;
	case ParquetMetadataOperatorType::BLOOM_PROBE: {
		auto &bloom_probe_bind_data = input.bind_data->Cast<ParquetBloomProbeBindData>();
		result->ExecuteBloomProbe(context, bind_data.return_types, bind_data.file_list->GetFirstFile(),
		                          bloom_probe_bind_data.probe_column_name, bloom_probe_bind_data.probe_constant);
		break;
	}
	default:
		throw InternalException("Unsupported ParquetMetadataOperatorType");
	}

	return std::move(result);
}